

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ParseString(JSONParser *this,string *out_string)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  SkipWhitespace(this);
  iVar2 = ReadChar(this);
  if (iVar2 == 0x22) {
    do {
      iVar2 = ReadChar(this);
      if (iVar2 == 0x22) {
        iVar2 = 3;
      }
      else if (iVar2 == 0x5c) {
        iVar2 = ReadChar(this);
        if (iVar2 == 0x75) {
          bVar6 = false;
          uVar5 = 0;
          uVar4 = 0;
          do {
            iVar2 = ReadChar(this);
            uVar3 = iVar2 - 0x30;
            if (uVar3 < 10) {
LAB_00125654:
              uVar4 = uVar4 * 0x10 + uVar3;
              bVar1 = true;
            }
            else {
              if (iVar2 - 0x61U < 6) {
                uVar3 = iVar2 - 0x57;
                goto LAB_00125654;
              }
              if (iVar2 - 0x41U < 6) {
                uVar3 = iVar2 - 0x37;
                goto LAB_00125654;
              }
              bVar1 = false;
              PrintError(this,"expected hex char");
            }
            if (!bVar1) {
              iVar2 = 1;
              goto LAB_001256a8;
            }
            bVar6 = 2 < uVar5;
            uVar5 = uVar5 + 1;
          } while (uVar5 != 4);
          iVar2 = 4;
LAB_001256a8:
          if (bVar6) {
            if ((uVar4 & 0xffff) < 0x100) goto LAB_001256bd;
            iVar2 = 0;
            PrintError(this,"only escape codes < 256 allowed, got %u\n");
          }
        }
        else {
          PrintError(this,"expected escape: \\uxxxx");
          iVar2 = 1;
        }
      }
      else {
LAB_001256bd:
        std::__cxx11::string::push_back((char)out_string);
        iVar2 = 0;
      }
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      return (Result)Ok;
    }
  }
  else {
    PrintError(this,"expected string");
  }
  return (Result)Error;
}

Assistant:

wabt::Result JSONParser::ParseString(std::string* out_string) {
  out_string->clear();

  SkipWhitespace();
  if (ReadChar() != '"') {
    PrintError("expected string");
    return wabt::Result::Error;
  }

  while (1) {
    int c = ReadChar();
    if (c == '"') {
      break;
    } else if (c == '\\') {
      /* The only escape supported is \uxxxx. */
      c = ReadChar();
      if (c != 'u') {
        PrintError("expected escape: \\uxxxx");
        return wabt::Result::Error;
      }
      uint16_t code = 0;
      for (int i = 0; i < 4; ++i) {
        c = ReadChar();
        int cval;
        if (c >= '0' && c <= '9') {
          cval = c - '0';
        } else if (c >= 'a' && c <= 'f') {
          cval = c - 'a' + 10;
        } else if (c >= 'A' && c <= 'F') {
          cval = c - 'A' + 10;
        } else {
          PrintError("expected hex char");
          return wabt::Result::Error;
        }
        code = (code << 4) + cval;
      }

      if (code < 256) {
        *out_string += code;
      } else {
        PrintError("only escape codes < 256 allowed, got %u\n", code);
      }
    } else {
      *out_string += c;
    }
  }
  return wabt::Result::Ok;
}